

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

cmSourceFile *
anon_unknown.dwarf_c07b1::AddCustomCommand
          (cmLocalGenerator *lg,cmCommandOrigin origin,
          unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc,bool replace)

{
  bool bVar1;
  cmMakefile *this;
  pointer pcVar2;
  cmListFileBacktrace *bt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs_00;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *this_01;
  string *sourceName;
  cmGlobalGenerator *pcVar3;
  const_reference output;
  cmCustomCommand *pcVar4;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *pvVar5;
  cmake *this_02;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_178;
  allocator<char> local_169;
  string local_168;
  int local_144;
  cmAlphaNum local_140;
  cmAlphaNum local_110;
  string local_e0;
  string local_b0;
  undefined1 local_90 [8];
  string outName;
  cmGlobalGenerator *gg;
  string *main_dependency;
  cmSourceFile *file;
  cmCustomCommandLines *commandLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *byproducts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs;
  cmListFileBacktrace *lfbt;
  cmMakefile *mf;
  bool replace_local;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc_local;
  cmCommandOrigin origin_local;
  cmLocalGenerator *lg_local;
  
  this = cmLocalGenerator::GetMakefile(lg);
  pcVar2 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc);
  bt = cmCustomCommand::GetBacktrace(pcVar2);
  pcVar2 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc);
  this_00 = cmCustomCommand::GetOutputs_abi_cxx11_(pcVar2);
  pcVar2 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc);
  outputs_00 = cmCustomCommand::GetByproducts_abi_cxx11_(pcVar2);
  pcVar2 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc);
  this_01 = &cmCustomCommand::GetCommandLines(pcVar2)->
             super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>;
  main_dependency = (string *)0x0;
  bVar1 = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::empty(this_01);
  if (!bVar1) {
    pcVar2 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc)
    ;
    bVar1 = cmCustomCommand::HasMainDependency(pcVar2);
    if (bVar1) {
      pcVar2 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                         (cc);
      sourceName = cmCustomCommand::GetMainDependency_abi_cxx11_(pcVar2);
      main_dependency = (string *)cmMakefile::GetSource(this,sourceName,Ambiguous);
      if ((((cmSourceFile *)main_dependency == (cmSourceFile *)0x0) ||
          (pcVar4 = cmSourceFile::GetCustomCommand((cmSourceFile *)main_dependency),
          pcVar4 == (cmCustomCommand *)0x0)) || (replace)) {
        if ((cmSourceFile *)main_dependency == (cmSourceFile *)0x0) {
          main_dependency = (string *)cmMakefile::CreateSource(this,sourceName,false,Ambiguous);
        }
      }
      else {
        pcVar4 = cmSourceFile::GetCustomCommand((cmSourceFile *)main_dependency);
        pvVar5 = &cmCustomCommand::GetCommandLines(pcVar4)->
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>;
        bVar1 = std::operator==(this_01,pvVar5);
        if (bVar1) {
          return (cmSourceFile *)main_dependency;
        }
        main_dependency = (string *)0x0;
      }
    }
  }
  if (main_dependency == (string *)0x0) {
    pcVar3 = cmLocalGenerator::GetGlobalGenerator(lg);
    outName.field_2._8_8_ = pcVar3;
    output = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](this_00,0);
    ComputeCustomCommandRuleFileName(&local_b0,lg,bt,output);
    (*pcVar3->_vptr_cmGlobalGenerator[0x33])(local_90,pcVar3,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    main_dependency = (string *)cmMakefile::GetSource(this,(string *)local_90,Known);
    if ((((cmLocalGenerator *)main_dependency == (cmLocalGenerator *)0x0) ||
        (pcVar4 = cmSourceFile::GetCustomCommand((cmSourceFile *)main_dependency),
        pcVar4 == (cmCustomCommand *)0x0)) || (replace)) {
      if ((cmLocalGenerator *)main_dependency == (cmLocalGenerator *)0x0) {
        main_dependency = (string *)cmMakefile::CreateSource(this,(string *)local_90,true,Known);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,"__CMAKE_RULE",&local_169);
      cmSourceFile::SetProperty((cmSourceFile *)main_dependency,&local_168,"1");
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator(&local_169);
      local_144 = 0;
    }
    else {
      pcVar4 = cmSourceFile::GetCustomCommand((cmSourceFile *)main_dependency);
      pvVar5 = &cmCustomCommand::GetCommandLines(pcVar4)->
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>;
      bVar1 = std::operator!=(this_01,pvVar5);
      if (bVar1) {
        this_02 = cmLocalGenerator::GetCMakeInstance(lg);
        cmAlphaNum::cmAlphaNum(&local_110,"Attempt to add a custom rule to output\n  ");
        cmAlphaNum::cmAlphaNum(&local_140,(string *)local_90);
        cmStrCat<char[34]>(&local_e0,&local_110,&local_140,
                           (char (*) [34])"\nwhich already has a custom rule.");
        cmake::IssueMessage(this_02,FATAL_ERROR,&local_e0,bt);
        std::__cxx11::string::~string((string *)&local_e0);
      }
      local_144 = 1;
      lg_local = (cmLocalGenerator *)main_dependency;
    }
    std::__cxx11::string::~string((string *)local_90);
    if (local_144 != 0) {
      return (cmSourceFile *)lg_local;
    }
  }
  if (main_dependency != (string *)0x0) {
    pcVar2 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc)
    ;
    cmCustomCommand::SetEscapeAllowMakeVars(pcVar2,true);
    cmLocalGenerator::AddSourceOutputs(lg,(cmSourceFile *)main_dependency,this_00,Primary,bt,origin)
    ;
    cmLocalGenerator::AddSourceOutputs
              (lg,(cmSourceFile *)main_dependency,outputs_00,Byproduct,bt,origin);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr
              (&local_178,cc);
    cmSourceFile::SetCustomCommand((cmSourceFile *)main_dependency,&local_178);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_178)
    ;
  }
  return (cmSourceFile *)main_dependency;
}

Assistant:

cmSourceFile* AddCustomCommand(cmLocalGenerator& lg, cmCommandOrigin origin,
                               std::unique_ptr<cmCustomCommand> cc,
                               bool replace)
{
  cmMakefile* mf = lg.GetMakefile();
  const auto& lfbt = cc->GetBacktrace();
  const auto& outputs = cc->GetOutputs();
  const auto& byproducts = cc->GetByproducts();
  const auto& commandLines = cc->GetCommandLines();

  // Choose a source file on which to store the custom command.
  cmSourceFile* file = nullptr;
  if (!commandLines.empty() && cc->HasMainDependency()) {
    const auto& main_dependency = cc->GetMainDependency();
    // The main dependency was specified.  Use it unless a different
    // custom command already used it.
    file = mf->GetSource(main_dependency);
    if (file && file->GetCustomCommand() && !replace) {
      // The main dependency already has a custom command.
      if (commandLines == file->GetCustomCommand()->GetCommandLines()) {
        // The existing custom command is identical.  Silently ignore
        // the duplicate.
        return file;
      }
      // The existing custom command is different.  We need to
      // generate a rule file for this new command.
      file = nullptr;
    } else if (!file) {
      file = mf->CreateSource(main_dependency);
    }
  }

  // Generate a rule file if the main dependency is not available.
  if (!file) {
    cmGlobalGenerator* gg = lg.GetGlobalGenerator();

    // Construct a rule file associated with the first output produced.
    std::string outName = gg->GenerateRuleFile(
      ComputeCustomCommandRuleFileName(lg, lfbt, outputs[0]));

    // Check if the rule file already exists.
    file = mf->GetSource(outName, cmSourceFileLocationKind::Known);
    if (file && file->GetCustomCommand() && !replace) {
      // The rule file already exists.
      if (commandLines != file->GetCustomCommand()->GetCommandLines()) {
        lg.GetCMakeInstance()->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("Attempt to add a custom rule to output\n  ", outName,
                   "\nwhich already has a custom rule."),
          lfbt);
      }
      return file;
    }

    // Create a cmSourceFile for the rule file.
    if (!file) {
      file = mf->CreateSource(outName, true, cmSourceFileLocationKind::Known);
    }
    file->SetProperty("__CMAKE_RULE", "1");
  }

  // Attach the custom command to the file.
  if (file) {
    cc->SetEscapeAllowMakeVars(true);

    lg.AddSourceOutputs(file, outputs, cmLocalGenerator::OutputRole::Primary,
                        lfbt, origin);
    lg.AddSourceOutputs(file, byproducts,
                        cmLocalGenerator::OutputRole::Byproduct, lfbt, origin);

    file->SetCustomCommand(std::move(cc));
  }
  return file;
}